

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_splice_range_Test::IntrusiveListTest_splice_range_Test
          (IntrusiveListTest_splice_range_Test *this)

{
  anon_unknown.dwarf_6462d::IntrusiveListTest::IntrusiveListTest(&this->super_IntrusiveListTest);
  (this->super_IntrusiveListTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_002e9920;
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_range) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200, 300});
  list1.splice(list1.begin(), list2, list2.begin(), std::prev(list2.end()));
  AssertListEq(list1, {100, 200, 1, 2, 3});
  AssertListEq(list2, {300});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3, std::next(list3.begin()), list3.end());
  AssertListEq(list1, {100, 200, 1, 2, 3, 600, 700});
  AssertListEq(list3, {500});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 4), list4, list4.begin(), list4.end());
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 600, 700});
  AssertListEq(list4, {});
}